

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O0

void __thiscall gmath::Camera::Camera(Camera *this,Properties *prop,int id)

{
  undefined8 *in_RDI;
  double dVar1;
  int in_stack_0000004c;
  char *in_stack_00000050;
  Camera *in_stack_00000058;
  char *in_stack_00000108;
  SMatrix<double,_3,_3> *in_stack_00000110;
  char *in_stack_00000118;
  Properties *in_stack_00000120;
  string local_108 [32];
  string local_e8 [31];
  char in_stack_ffffffffffffff37;
  char *in_stack_ffffffffffffff38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Properties *in_stack_ffffffffffffff50;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [72];
  
  *in_RDI = &PTR__Camera_001c57d0;
  std::__cxx11::string::string((string *)(in_RDI + 1));
  SMatrix<double,_3,_3>::SMatrix((SMatrix<double,_3,_3> *)(in_RDI + 7));
  SVector<double,_3>::SVector((SVector<double,_3> *)(in_RDI + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1900bd);
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
            (in_stack_00000120,in_stack_00000118,in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_48);
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<gmath::SVector<double,3>>
            (in_stack_00000120,in_stack_00000118,(SVector<double,_3> *)in_stack_00000110,
             in_stack_00000108);
  std::__cxx11::string::~string(local_68);
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<long>
            (in_stack_00000120,in_stack_00000118,(long *)in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_88);
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<long>
            (in_stack_00000120,in_stack_00000118,(long *)in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_a8);
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000120,in_stack_00000118,(double *)in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getValue<double>
            (in_stack_00000120,in_stack_00000118,(double *)in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_e8);
  if ((double)in_RDI[0x14] <= 0.0 && (double)in_RDI[0x14] != 0.0) {
    dVar1 = std::numeric_limits<double>::max();
    in_RDI[0x14] = dVar1;
  }
  getCameraKey_abi_cxx11_(in_stack_00000058,in_stack_00000050,in_stack_0000004c);
  std::__cxx11::string::c_str();
  gutil::Properties::getStringVector
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38,in_stack_ffffffffffffff37);
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

Camera::Camera(const gutil::Properties &prop, int id)
{
  prop.getValue(getCameraKey("R", id).c_str(), R, "[1 0 0; 0 1 0; 0 0 1]");
  prop.getValue(getCameraKey("T", id).c_str(), T, "[0 0 0]");
  prop.getValue(getCameraKey("width", id).c_str(), width, "0");
  prop.getValue(getCameraKey("height", id).c_str(), height, "0");

  prop.getValue(getCameraKey("zmin", id).c_str(), zmin, "0");
  prop.getValue(getCameraKey("zmax", id).c_str(), zmax, "-1");

  if (zmax < 0)
  {
    zmax=std::numeric_limits<double>::max();
  }

  prop.getStringVector(getCameraKey("match", id).c_str(), match, "", ',');
}